

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freopen.c
# Opt level: O2

FILE * freopen(char *__filename,char *__modes,FILE *__stream)

{
  char **mtx;
  uint uVar1;
  int iVar2;
  uint uVar3;
  _PDCLIB_fd_t _Var4;
  int *piVar5;
  _PDCLIB_file_t *p_Var6;
  char *pcVar7;
  
  uVar1 = _PDCLIB_filemode(__modes);
  if (__stream == (FILE *)0x0) {
    piVar5 = _PDCLIB_errno_func();
    *piVar5 = 9;
    return (FILE *)0x0;
  }
  mtx_lock(&_PDCLIB_filelist_mtx);
  iVar2 = _PDCLIB_isstream((_PDCLIB_file_t *)__stream,(_PDCLIB_file_t **)0x0);
  mtx = &__stream->_IO_save_base;
  if (iVar2 == 0) {
    iVar2 = mtx_init((mtx_t *)mtx,1);
    if (iVar2 != 1) goto LAB_00105075;
    mtx_lock((mtx_t *)mtx);
  }
  else {
    mtx_lock((mtx_t *)mtx);
    if (((ulong)__stream->_IO_buf_end & 0x1000000000) != 0) {
      _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream);
    }
    if (__filename == (char *)0x0) {
      iVar2 = _PDCLIB_changemode((_PDCLIB_file_t *)__stream,uVar1);
      if (iVar2 != 0) goto LAB_001050ad;
      __filename = *(char **)&__stream->_fileno;
      __stream->_fileno = 0;
      __stream->_flags2 = 0;
    }
    _PDCLIB_close(__stream->_flags);
    _PDCLIB_getstream((_PDCLIB_file_t *)__stream);
    uVar3 = *(uint *)((long)&__stream->_IO_buf_end + 4);
    if ((uVar3 >> 0xd & 1) != 0) {
      pcVar7 = *(char **)&__stream->_fileno;
      if (*(char **)&__stream->_fileno == (char *)0x0) {
        pcVar7 = __filename;
      }
      _PDCLIB_remove(pcVar7);
      uVar3 = *(uint *)((long)&__stream->_IO_buf_end + 4) & 0xffffdfff;
      *(uint *)((long)&__stream->_IO_buf_end + 4) = uVar3;
    }
    if ((uVar3 >> 8 & 1) != 0) {
      free(__stream->_IO_read_ptr);
    }
    if (__filename == (char *)0x0) {
      return (FILE *)0x0;
    }
    free(*(void **)&__stream->_fileno);
  }
  if ((((uVar1 == 0) || (__filename == (char *)0x0)) || (*__filename == '\0')) ||
     (p_Var6 = _PDCLIB_init_file_t((_PDCLIB_file_t *)__stream), p_Var6 == (_PDCLIB_file_t *)0x0)) {
    mtx_unlock((mtx_t *)mtx);
    mtx_destroy((mtx_t *)mtx);
    pcVar7 = *(char **)&__stream->_fileno;
  }
  else {
    uVar1 = *(uint *)((long)&__stream->_IO_buf_end + 4) | uVar1 | 2;
    *(uint *)((long)&__stream->_IO_buf_end + 4) = uVar1;
    _Var4 = _PDCLIB_open(__filename,uVar1);
    __stream->_flags = _Var4;
    if (_Var4 != -1) {
      pcVar7 = _PDCLIB_realpath(__filename);
      *(char **)&__stream->_fileno = pcVar7;
      __stream->_old_offset = (__off_t)_PDCLIB_filelist;
      _PDCLIB_filelist = (_PDCLIB_file_t *)__stream;
LAB_001050ad:
      mtx_unlock((mtx_t *)mtx);
      mtx_unlock(&_PDCLIB_filelist_mtx);
      return __stream;
    }
    mtx_unlock((mtx_t *)mtx);
    mtx_destroy((mtx_t *)mtx);
    free(*(void **)&__stream->_fileno);
    pcVar7 = __stream->_IO_read_ptr;
  }
  free(pcVar7);
  free(__stream);
LAB_00105075:
  mtx_unlock(&_PDCLIB_filelist_mtx);
  return (FILE *)0x0;
}

Assistant:

struct _PDCLIB_file_t * freopen( const char * _PDCLIB_restrict filename, const char * _PDCLIB_restrict mode, struct _PDCLIB_file_t * _PDCLIB_restrict stream )
{
    unsigned int filemode = _PDCLIB_filemode( mode );

    if ( stream == NULL )
    {
        errno = EBADF;
        return NULL;
    }

    _PDCLIB_LOCK( _PDCLIB_filelist_mtx );

    if ( _PDCLIB_isstream( stream, NULL ) )
    {
        /* May lock only after established that stream is valid */
        _PDCLIB_LOCK( stream->mtx );

        /* Flush buffer */
        if ( stream->status & _PDCLIB_FWRITE )
        {
            _PDCLIB_flushbuffer( stream );
        }

        if ( filename == NULL )
        {
            /* Attempt to change mode without closing stream */
            switch ( _PDCLIB_changemode( stream, filemode ) )
            {
                case INT_MIN:
                    /* fail completely */
                    _PDCLIB_UNLOCK( stream->mtx );
                    _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
                    return NULL;

                case 0:
                    /* fail; try close / reopen */
                    filename = stream->filename;
                    /* Setting to NULL to make the free() below a non-op. */
                    stream->filename = NULL;
                    break;

                default:
                    /* success */
                    _PDCLIB_UNLOCK( stream->mtx );
                    _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
                    return stream;
            }
        }

        /* Close handle */
        _PDCLIB_close( stream->handle );

        /* Remove stream from list */
        _PDCLIB_getstream( stream );

        /* Delete tmpfile() */
        if ( stream->status & _PDCLIB_DELONCLOSE )
        {
            /* Have to switch here; stream->filename may have moved to
               filename after failed in-place mode change above.
            */
            _PDCLIB_remove( ( stream->filename == NULL ) ? filename : stream->filename );
            stream->status &= ~_PDCLIB_DELONCLOSE;
        }

        /* Free buffer */
        if ( stream->status & _PDCLIB_FREEBUFFER )
        {
            free( stream->buffer );
        }

        if ( filename == NULL )
        {
            /* Input was filename NULL, stream->filename NULL.
               No filename means there is nothing to reopen. In-place
               mode change was already attempted (and failed) above.
            */
            return NULL;
        }
        else
        {
            /* We have a filename, either from input or (if filename
               was NULL) from stream. We will attempt the re-open with
               that, and will retrieve _PDCLIB_realpath() from that.
               So stream->filename is no longer needed.
            */
            free( stream->filename );
        }
    }
    else
    {
        /* Not a valid stream. As _PDCLIB_init_file_t() cannot tell the
           difference, only knows that it has been called by freopen()
           (by the non-NULL parameter), we need to initialize the mutex
           here (so that either way, _PDCLIB_init_file_t() gets a pre-
           initialized mutex).
        */
#ifndef __STDC_NO_THREADS__
        if ( mtx_init( &stream->mtx, mtx_plain | mtx_recursive ) != thrd_success )
        {
            /* Could not initialize stream mutex */
            _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
            return NULL;
        }

#endif

        /* Locking the mutex, so we come out of the if-else with a locked
           mutex either way.
        */
        _PDCLIB_LOCK( stream->mtx );
    }

    /* Stream is closed, or never was open (even though its mutex exists
       and is locked) at this point.
       Now we check if we have the whereabouts to open it.
    */

    if ( filemode == 0 )
    {
        /* Mode invalid */
        _PDCLIB_UNLOCK( stream->mtx );
#ifndef __STDC_NO_THREADS__
        mtx_destroy( &stream->mtx );
#endif
        free( stream->filename );
        free( stream );
        _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
        return NULL;
    }

    if ( filename == NULL || filename[0] == '\0' )
    {
        /* No filename available (standard stream?) */
        _PDCLIB_UNLOCK( stream->mtx );
#ifndef __STDC_NO_THREADS__
        mtx_destroy( &stream->mtx );
#endif
        free( stream->filename );
        free( stream );
        _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
        return NULL;
    }

    /* (Re-)initializing the structure. */
    if ( _PDCLIB_init_file_t( stream ) == NULL )
    {
        /* Re-init failed. */
        _PDCLIB_UNLOCK( stream->mtx );
#ifndef __STDC_NO_THREADS__
        mtx_destroy( &stream->mtx );
#endif
        free( stream->filename );
        free( stream );
        _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
        return NULL;
    }

    /* Resetting buffer mode and filemode */
    stream->status |= filemode | _IOLBF;

    /* Attempt open */
    if ( ( stream->handle = _PDCLIB_open( filename, stream->status ) ) == _PDCLIB_NOHANDLE )
    {
        /* OS open() failed */
        _PDCLIB_UNLOCK( stream->mtx );
#ifndef __STDC_NO_THREADS__
        mtx_destroy( &stream->mtx );
#endif
        free( stream->filename );
        free( stream->buffer );
        free( stream );
        _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
        return NULL;
    }

    /* Getting absolute filename */
    stream->filename = _PDCLIB_realpath( filename );

    /* Adding to list of open files */
    stream->next = _PDCLIB_filelist;
    _PDCLIB_filelist = stream;

    _PDCLIB_UNLOCK( stream->mtx );
    _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );

    return stream;
}